

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.cpp
# Opt level: O0

p_ply ply_create(char *name,e_ply_storage_mode storage_mode,p_ply_error_cb error_cb,long idata,
                void *pdata)

{
  int iVar1;
  e_ply_storage_mode eVar2;
  FILE *pFVar3;
  long in_RCX;
  p_ply_error_cb in_RDX;
  e_ply_storage_mode in_ESI;
  char *in_RDI;
  void *in_R8;
  p_ply ply;
  FILE *fp;
  p_ply_error_cb local_20;
  e_ply_storage_mode local_14;
  p_ply local_8;
  
  local_8 = ply_alloc();
  local_20 = in_RDX;
  if (in_RDX == (p_ply_error_cb)0x0) {
    local_20 = ply_error_cb;
  }
  if (local_8 == (p_ply)0x0) {
    (*local_20)((p_ply)0x0,"Out of memory");
    local_8 = (p_ply)0x0;
  }
  else {
    iVar1 = ply_type_check();
    if (iVar1 == 0) {
      (*local_20)(local_8,"Incompatible type system");
      free(local_8);
      local_8 = (p_ply)0x0;
    }
    else {
      pFVar3 = fopen(in_RDI,"wb");
      if (pFVar3 == (FILE *)0x0) {
        (*local_20)(local_8,"Unable to create file");
        free(local_8);
        local_8 = (p_ply)0x0;
      }
      else {
        local_8->idata = in_RCX;
        local_8->pdata = in_R8;
        local_8->io_mode = PLY_WRITE;
        local_14 = in_ESI;
        if (in_ESI == PLY_DEFAULT) {
          local_14 = ply_arch_endian();
        }
        if (local_14 == PLY_ASCII) {
          local_8->odriver = (p_ply_odriver)(anonymous_namespace)::ply_odriver_ascii;
        }
        else {
          eVar2 = ply_arch_endian();
          if (local_14 == eVar2) {
            local_8->odriver = (p_ply_odriver)(anonymous_namespace)::ply_odriver_binary;
          }
          else {
            local_8->odriver = (p_ply_odriver)(anonymous_namespace)::ply_odriver_binary_reverse;
          }
        }
        local_8->storage_mode = local_14;
        local_8->fp = (FILE *)pFVar3;
        local_8->gzfp = (gzFile)0x0;
        local_8->error_cb = local_20;
      }
    }
  }
  return local_8;
}

Assistant:

p_ply ply_create(const char *name, e_ply_storage_mode storage_mode,
                 p_ply_error_cb error_cb, long idata, void *pdata) {
    FILE *fp = NULL;
    p_ply ply = ply_alloc();
    if (error_cb == NULL) error_cb = ply_error_cb;
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    if (!ply_type_check()) {
        error_cb(ply, "Incompatible type system");
        free(ply);
        return NULL;
    }
    assert(name && storage_mode <= PLY_DEFAULT);
    fp = fopen(name, "wb");
    if (!fp) {
        error_cb(ply, "Unable to create file");
        free(ply);
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_WRITE;
    if (storage_mode == PLY_DEFAULT) storage_mode = ply_arch_endian();
    if (storage_mode == PLY_ASCII)
        ply->odriver = &ply_odriver_ascii;
    else if (storage_mode == ply_arch_endian())
        ply->odriver = &ply_odriver_binary;
    else
        ply->odriver = &ply_odriver_binary_reverse;
    ply->storage_mode = storage_mode;
    ply->fp = fp;
    ply->gzfp = nullptr;  // gzipped writing isn't implemented...
    ply->error_cb = error_cb;
    return ply;
}